

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrdb.cpp
# Opt level: O2

Result<std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_> *
LoadAddrman(Result<std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_> *__return_storage_ptr__
           ,NetGroupManager *netgroupman,ArgsManager *args)

{
  long lVar1;
  string_view source_file;
  __single_object _Var2;
  bool bVar3;
  uint uVar4;
  int64_t iVar5;
  long lVar6;
  FILE *pFVar7;
  CChainParams *pCVar8;
  long lVar9;
  Logger *pLVar10;
  runtime_error *this;
  char *p2;
  code *pcVar11;
  pointer_____offset_0x10___ *ppuVar12;
  long *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  __uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_> local_2e8 [2];
  __single_object addrman;
  bool deterministic;
  int check_addrman;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_2c8;
  unsigned_long local_2a8 [2];
  MessageStartChars pchMsgTmp;
  string local_1d8 [4];
  path local_158;
  path path_addr;
  HashVerifier<AutoFile> verifier;
  base_blob<256U> local_78;
  uint256 hashTmp;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&verifier,"-checkaddrman",(allocator<char> *)local_1d8);
  iVar5 = ArgsManager::GetIntArg(args,(string *)&verifier,0);
  uVar4 = (uint)iVar5;
  check_addrman = 1000000;
  if (uVar4 < 1000000) {
    check_addrman = uVar4;
  }
  if ((int)uVar4 < 0) {
    check_addrman = 0;
  }
  std::__cxx11::string::~string((string *)&verifier);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&verifier,"addrman",(allocator<char> *)local_1d8);
  bVar3 = HasTestOption(args,(string *)&verifier);
  std::__cxx11::string::~string((string *)&verifier);
  deterministic = bVar3;
  std::make_unique<AddrMan,NetGroupManager_const&,bool&,int&>
            ((NetGroupManager *)&addrman,(bool *)netgroupman,(int *)&deterministic);
  lVar6 = std::chrono::_V2::steady_clock::now();
  ArgsManager::GetDataDirNet((path *)&local_158,args);
  fs::operator/(&path_addr,(path *)&local_158,p2);
  std::filesystem::__cxx11::path::~path(&local_158);
  _Var2 = addrman;
  pFVar7 = fsbridge::fopen((char *)&path_addr,"rb");
  local_1d8[0]._M_string_length = 0;
  local_1d8[0].field_2._M_allocated_capacity = 0;
  local_1d8[0].field_2._8_8_ = 0;
  local_2c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d8[0]._M_dataplus._M_p = (pointer)pFVar7;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_2c8);
  if (pFVar7 == (FILE *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(8);
    *(undefined ***)this = &PTR__exception_0114f900;
    pcVar11 = std::exception::~exception;
    ppuVar12 = &(anonymous_namespace)::DbNotFoundError::typeinfo;
  }
  else {
    CSHA256::CSHA256((CSHA256 *)&verifier);
    verifier.m_source = (AutoFile *)local_1d8;
    Unserialize<HashVerifier<AutoFile>,_unsigned_char,_4UL>(&verifier,&pchMsgTmp);
    pCVar8 = Params();
    bVar3 = std::operator==(&pchMsgTmp,&pCVar8->pchMessageStart);
    if (bVar3) {
      AddrMan::Unserialize<HashVerifier<AutoFile>>
                ((AddrMan *)
                 _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                 super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                 super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&verifier);
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[1] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[2] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[3] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[4] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[5] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[6] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[7] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      hashTmp.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      base_blob<256U>::Unserialize<AutoFile>(&hashTmp.super_base_blob<256U>,(AutoFile *)local_1d8);
      HashWriter::GetHash((uint256 *)&local_78,&verifier.super_HashWriter);
      bVar3 = operator!=(&hashTmp.super_base_blob<256U>,&local_78);
      if (!bVar3) {
        AutoFile::~AutoFile((AutoFile *)local_1d8);
        local_2c8._M_impl.super__Vector_impl_data._M_start =
             (pointer)AddrMan::Size((AddrMan *)
                                    addrman._M_t.
                                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                                    _M_t.
                                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>
                                    .super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                                    (optional<Network>)0x0,(optional<bool>)0x0);
        lVar9 = std::chrono::_V2::steady_clock::now();
        local_2a8[0] = (lVar9 - lVar6) / 1000000;
        pLVar10 = LogInstance();
        bVar3 = BCLog::Logger::Enabled(pLVar10);
        if (bVar3) {
          verifier.super_HashWriter.ctx.s._0_8_ = verifier.super_HashWriter.ctx.s + 4;
          verifier.super_HashWriter.ctx.s[2] = 0;
          verifier.super_HashWriter.ctx.s[3] = 0;
          verifier.super_HashWriter.ctx.s[4]._0_1_ = 0;
          tinyformat::format<unsigned_long,long>
                    (local_1d8,(tinyformat *)"Loaded %i addresses from peers.dat  %dms\n",
                     (char *)&local_2c8,local_2a8,in_R8);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&verifier,
                     local_1d8);
          std::__cxx11::string::~string((string *)local_1d8);
          pLVar10 = LogInstance();
          hashTmp.super_base_blob<256U>.m_data._M_elems[0] = 'S';
          hashTmp.super_base_blob<256U>.m_data._M_elems[1] = '\0';
          hashTmp.super_base_blob<256U>.m_data._M_elems[2] = '\0';
          hashTmp.super_base_blob<256U>.m_data._M_elems[3] = '\0';
          hashTmp.super_base_blob<256U>.m_data._M_elems[4] = '\0';
          hashTmp.super_base_blob<256U>.m_data._M_elems[5] = '\0';
          hashTmp.super_base_blob<256U>.m_data._M_elems[6] = '\0';
          hashTmp.super_base_blob<256U>.m_data._M_elems[7] = '\0';
          hashTmp.super_base_blob<256U>.m_data._M_elems._8_8_ = anon_var_dwarf_1e43eef;
          source_file._M_str =
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/addrdb.cpp"
          ;
          source_file._M_len = 0x53;
          str._M_str = (char *)verifier.super_HashWriter.ctx.s._0_8_;
          str._M_len._0_4_ = verifier.super_HashWriter.ctx.s[2];
          str._M_len._4_4_ = verifier.super_HashWriter.ctx.s[3];
          logging_function._M_str = "LoadAddrman";
          logging_function._M_len = 0xb;
          BCLog::Logger::LogPrintStr(pLVar10,str,logging_function,source_file,0xca,ALL,Info);
          std::__cxx11::string::~string((string *)&verifier);
        }
        _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
        super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
             addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
        addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
        super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
             (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
             (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)0x0;
        *(__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true> *)
         &(__return_storage_ptr__->m_variant).
          super__Variant_base<bilingual_str,_std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_>
          .super__Move_assign_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
          super__Copy_assign_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
          super__Move_ctor_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
          super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
          super__Variant_storage_alias<bilingual_str,_std::unique_ptr<AddrMan>_> =
             _Var2._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
        local_2e8[0]._M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
             (tuple<AddrMan_*,_std::default_delete<AddrMan>_>)
             (_Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>)0x0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>_>
                 .super__Move_assign_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
                 super__Copy_assign_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
                 super__Move_ctor_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
                 super__Copy_ctor_alias<bilingual_str,_std::unique_ptr<AddrMan>_>.
                 super__Variant_storage_alias<bilingual_str,_std::unique_ptr<AddrMan>_> + 0x40) =
             '\x01';
        std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr
                  ((unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *)local_2e8);
        std::filesystem::__cxx11::path::~path(&path_addr.super_path);
        std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return __return_storage_ptr__;
        }
        goto LAB_006a1dbd;
      }
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Checksum mismatch, data corrupted");
    }
    else {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Invalid network magic number");
    }
    pcVar11 = std::runtime_error::~runtime_error;
    ppuVar12 = (pointer_____offset_0x10___ *)&std::runtime_error::typeinfo;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    __cxa_throw(this,ppuVar12,pcVar11);
  }
LAB_006a1dbd:
  __stack_chk_fail();
}

Assistant:

util::Result<std::unique_ptr<AddrMan>> LoadAddrman(const NetGroupManager& netgroupman, const ArgsManager& args)
{
    auto check_addrman = std::clamp<int32_t>(args.GetIntArg("-checkaddrman", DEFAULT_ADDRMAN_CONSISTENCY_CHECKS), 0, 1000000);
    bool deterministic = HasTestOption(args, "addrman"); // use a deterministic addrman only for tests

    auto addrman{std::make_unique<AddrMan>(netgroupman, deterministic, /*consistency_check_ratio=*/check_addrman)};

    const auto start{SteadyClock::now()};
    const auto path_addr{args.GetDataDirNet() / "peers.dat"};
    try {
        DeserializeFileDB(path_addr, *addrman);
        LogPrintf("Loaded %i addresses from peers.dat  %dms\n", addrman->Size(), Ticks<std::chrono::milliseconds>(SteadyClock::now() - start));
    } catch (const DbNotFoundError&) {
        // Addrman can be in an inconsistent state after failure, reset it
        addrman = std::make_unique<AddrMan>(netgroupman, deterministic, /*consistency_check_ratio=*/check_addrman);
        LogPrintf("Creating peers.dat because the file was not found (%s)\n", fs::quoted(fs::PathToString(path_addr)));
        DumpPeerAddresses(args, *addrman);
    } catch (const InvalidAddrManVersionError&) {
        if (!RenameOver(path_addr, (fs::path)path_addr + ".bak")) {
            return util::Error{strprintf(_("Failed to rename invalid peers.dat file. Please move or delete it and try again."))};
        }
        // Addrman can be in an inconsistent state after failure, reset it
        addrman = std::make_unique<AddrMan>(netgroupman, deterministic, /*consistency_check_ratio=*/check_addrman);
        LogPrintf("Creating new peers.dat because the file version was not compatible (%s). Original backed up to peers.dat.bak\n", fs::quoted(fs::PathToString(path_addr)));
        DumpPeerAddresses(args, *addrman);
    } catch (const std::exception& e) {
        return util::Error{strprintf(_("Invalid or corrupt peers.dat (%s). If you believe this is a bug, please report it to %s. As a workaround, you can move the file (%s) out of the way (rename, move, or delete) to have a new one created on the next start."),
                                     e.what(), PACKAGE_BUGREPORT, fs::quoted(fs::PathToString(path_addr)))};
    }
    return addrman;
}